

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyraytracer.cpp
# Opt level: O1

bool scene_intersect(Vec3f *orig,Vec3f *dir,vector<Sphere,_std::allocator<Sphere>_> *spheres,
                    Vec3f *hit,Vec3f *N,Material *material)

{
  float fVar1;
  pointer pSVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  pointer pSVar6;
  float fVar7;
  vec<3UL,_float> vVar8;
  float d;
  float dist_i;
  Sphere sphere;
  vec<3UL,_float> local_b0;
  float local_a4;
  float local_a0;
  float local_9c;
  undefined1 local_98 [16];
  float local_88;
  float local_84;
  Vec3f *local_80;
  Vec3f *local_78;
  Material *local_70;
  Sphere local_68;
  
  pSVar6 = (spheres->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (spheres->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_a0 = 3.4028235e+38;
  local_a4 = 3.4028235e+38;
  local_80 = N;
  local_78 = hit;
  local_70 = material;
  if (pSVar6 != pSVar2) {
    local_a4 = 3.4028235e+38;
    do {
      local_68.material.specular_exponent = (pSVar6->material).specular_exponent;
      local_68.center.x = (pSVar6->center).x;
      local_68.center.y = (pSVar6->center).y;
      local_68._8_8_ = *(undefined8 *)&(pSVar6->center).z;
      local_68.material.refractive_index = (pSVar6->material).refractive_index;
      local_68.material.albedo.x = (pSVar6->material).albedo.x;
      local_68.material.albedo.y = (pSVar6->material).albedo.y;
      local_68.material.albedo.z = (pSVar6->material).albedo.z;
      local_68.material._16_8_ = *(undefined8 *)&(pSVar6->material).albedo.w;
      local_68.material.diffuse_color.y = (pSVar6->material).diffuse_color.y;
      local_68.material.diffuse_color.z = (pSVar6->material).diffuse_color.z;
      bVar3 = Sphere::ray_intersect(&local_68,orig,dir,&local_84);
      if ((bVar3) && (local_84 < local_a4)) {
        local_a4 = local_84;
        local_98._0_4_ = orig->x;
        local_98._4_4_ = orig->y;
        local_9c = orig->z;
        vVar8 = operator*(dir,&local_84);
        local_98._8_8_ = vVar8._0_8_;
        local_88 = vVar8.z;
        local_b0.x = (float)local_98._0_4_;
        local_b0.y = (float)local_98._4_4_;
        local_b0.z = local_9c;
        lVar4 = -1;
        do {
          lVar5 = (ulong)(lVar4 != 0) * 4 + 4;
          if (lVar4 == 1) {
            lVar5 = 0;
          }
          *(float *)((long)&local_b0.x + lVar5) =
               *(float *)((long)&local_b0.x + lVar5) + *(float *)(local_98 + lVar5 + 8);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 2);
        local_78->x = local_b0.x;
        local_78->y = local_b0.y;
        local_78->z = local_b0.z;
        lVar4 = -1;
        do {
          lVar5 = 0;
          if (lVar4 != 1) {
            lVar5 = (ulong)(lVar4 != 0) * 4 + 4;
          }
          *(float *)((long)&local_b0.x + lVar5) =
               *(float *)((long)&local_b0.x + lVar5) - *(float *)((long)&local_68.center.x + lVar5);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 2);
        local_98._0_4_ = 0x3f800000;
        fVar7 = sqrtf(local_b0.z * local_b0.z + local_b0.x * local_b0.x + local_b0.y * local_b0.y);
        local_98._8_4_ = (float)local_98._0_4_ / fVar7;
        vVar8 = operator*(&local_b0,(float *)(local_98 + 8));
        local_b0.z = vVar8.z;
        local_b0._0_8_ = vVar8._0_8_;
        local_80->z = local_b0.z;
        local_80->x = local_b0.x;
        local_80->y = local_b0.y;
        local_70->specular_exponent = local_68.material.specular_exponent;
        *(undefined8 *)&(local_70->albedo).w = local_68.material._16_8_;
        (local_70->diffuse_color).y = local_68.material.diffuse_color.y;
        (local_70->diffuse_color).z = local_68.material.diffuse_color.z;
        local_70->refractive_index = local_68.material.refractive_index;
        (local_70->albedo).x = local_68.material.albedo.x;
        (local_70->albedo).y = local_68.material.albedo.y;
        (local_70->albedo).z = local_68.material.albedo.z;
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar2);
  }
  fVar7 = dir->y;
  if (0.001 <= ABS(fVar7) && ABS(fVar7) != 0.001) {
    local_98._8_4_ = -(orig->y + 4.0) / fVar7;
    local_98._0_4_ = orig->x;
    local_98._4_4_ = orig->y;
    local_9c = orig->z;
    vVar8 = operator*(dir,(float *)(local_98 + 8));
    local_b0.x = (float)vVar8._0_8_;
    local_b0.y = SUB84(vVar8._0_8_,4);
    local_b0.z = vVar8.z;
    local_68.center.x = (float)local_98._0_4_;
    local_68.center.y = (float)local_98._4_4_;
    local_68.center.z = local_9c;
    lVar4 = -1;
    do {
      lVar5 = (ulong)(lVar4 != 0) * 4 + 4;
      if (lVar4 == 1) {
        lVar5 = 0;
      }
      *(float *)((long)&local_68.center.x + lVar5) =
           *(float *)((long)&local_68.center.x + lVar5) + *(float *)((long)&local_b0.x + lVar5);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    local_a0 = 3.4028235e+38;
    if ((((0.0 < (float)local_98._8_4_) &&
         (ABS(local_68.center.x) <= 10.0 && ABS(local_68.center.x) != 10.0)) &&
        (local_68.center.z < -10.0)) &&
       ((-30.0 < local_68.center.z && ((float)local_98._8_4_ < local_a4)))) {
      local_78->x = local_68.center.x;
      local_78->y = local_68.center.y;
      local_78->z = local_68.center.z;
      local_80->x = 0.0;
      local_80->y = 1.0;
      local_80->z = 0.0;
      lVar4 = (ulong)(((int)(local_78->z * 0.5) + (int)(local_78->x * 0.5 + 1000.0) & 1U) == 0) * 4;
      fVar7 = *(float *)(&DAT_00104090 + lVar4);
      fVar1 = *(float *)(&DAT_00104098 + lVar4);
      (local_70->diffuse_color).x = 0.3;
      (local_70->diffuse_color).y = fVar1;
      (local_70->diffuse_color).z = fVar7;
      local_a0 = (float)local_98._8_4_;
    }
  }
  if (local_a4 <= local_a0) {
    local_a0 = local_a4;
  }
  return local_a0 < 1000.0;
}

Assistant:

bool scene_intersect(Vec3f const& orig, Vec3f const& dir,
                     std::vector<Sphere> const& spheres, Vec3f& hit, Vec3f& N,
                     Material& material)
{
  auto spheres_dist = std::numeric_limits<float>::max();
  for (auto sphere : spheres)
  {
    float dist_i;
    if (sphere.ray_intersect(orig, dir, dist_i) && dist_i < spheres_dist)
    {
      spheres_dist = dist_i;
      hit          = orig + dir * dist_i;
      N            = (hit - sphere.center).normalize();
      material     = sphere.material;
    }
  }

  float checkerboard_dist = std::numeric_limits<float>::max();
  if (fabs(dir.y) > 1e-3f)
  {
    float d  = -(orig.y + 4) / dir.y;  // Checkerboard plane is y = -4
    Vec3f pt = orig + dir * d;
    if (d > 0 && fabs(pt.x) < 10 && pt.z < -10 && pt.z > -30 &&
        d < spheres_dist)
    {
      checkerboard_dist = d;
      hit               = pt;
      N                 = Vec3f(0, 1, 0);
      material.diffuse_color =
          (int(.5f * hit.x + 1000) + int(.5f * hit.z)) & 1  // NOLINT
              ? Vec3f(.3f, .3f, .3f)
              : Vec3f(.3f, .2f, .1f);
    }
  }
  return std::min(spheres_dist, checkerboard_dist) < 1000;
}